

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Signal_PDU::Encode(Signal_PDU *this,KDataStream *stream)

{
  KOCTET *pKVar1;
  KOCTET *pKVar2;
  
  Radio_Communications_Header::Encode(&this->super_Radio_Communications_Header,stream);
  (*(this->m_EncodingScheme).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EncodingScheme,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32SampleRate);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16DataLength);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Samples);
  pKVar1 = (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pKVar2 = (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
    KDataStream::Write(stream,*pKVar2);
  }
  return;
}

Assistant:

void Signal_PDU::Encode( KDataStream & stream ) const
{
    Radio_Communications_Header::Encode( stream );

    stream << KDIS_STREAM m_EncodingScheme
           << m_ui32SampleRate
           << m_ui16DataLength
           << m_ui16Samples;

    vector<KOCTET>::const_iterator citr = m_vData.begin();
    vector<KOCTET>::const_iterator citrEnd = m_vData.end();
    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }
}